

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O3

int snprintf_can_error_frame(char *buf,size_t len,canfd_frame *cf,char *sep)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  int *piVar6;
  size_t sVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  
  uVar1 = cf->can_id;
  iVar8 = 0;
  if ((uVar1 >> 0x1d & 1) != 0) {
    if ((uVar1 & 0x1fffffff) < 0x401) {
      pcVar4 = ",";
      if (sep != (char *)0x0) {
        pcVar4 = sep;
      }
      piVar6 = &error_classes_rel;
      lVar12 = 0;
      iVar5 = 0;
      iVar8 = 0;
      do {
        if ((uVar1 >> ((uint)lVar12 & 0x1f) & 1) == 0) goto LAB_0010267e;
        if (iVar5 != 0) {
          uVar11 = len - (long)iVar8;
          uVar2 = snprintf(buf + iVar8,uVar11,"%s",pcVar4);
          if (((int)uVar2 < 0) || (uVar11 <= uVar2)) goto LAB_001026ff;
          iVar8 = iVar8 + uVar2;
        }
        uVar11 = len - (long)iVar8;
        uVar2 = snprintf(buf + iVar8,uVar11,"%s",(long)&error_classes_rel + (long)*piVar6);
        if (((int)uVar2 < 0) || (uVar11 <= uVar2)) {
LAB_001026ff:
          *buf = '\0';
          return 0;
        }
        iVar8 = uVar2 + iVar8;
        switch((uint)lVar12) {
        case 1:
          iVar9 = 0;
          sVar7 = len - (long)iVar8;
          if (sVar7 != 0) {
            iVar9 = snprintf(buf + iVar8,sVar7,"{at bit %d}",(ulong)cf->data[0]);
          }
          break;
        case 2:
          iVar9 = 0;
          sVar7 = len - (long)iVar8;
          if (sVar7 != 0) {
            pcVar10 = buf + iVar8;
            iVar9 = snprintf(pcVar10,sVar7,"{");
            iVar3 = snprintf_error_data(pcVar10 + iVar9,sVar7 - (long)iVar9,cf->data[1],
                                        controller_problems,7);
            iVar9 = iVar9 + iVar3;
            iVar3 = snprintf(pcVar10 + iVar9,sVar7 - (long)iVar9,"}");
            iVar9 = iVar9 + iVar3;
          }
          goto LAB_00102635;
        case 3:
          iVar9 = 0;
          sVar7 = len - (long)iVar8;
          if (sVar7 != 0) {
            pcVar10 = buf + iVar8;
            iVar9 = snprintf(pcVar10,sVar7,"{{");
            iVar3 = snprintf_error_data(pcVar10 + iVar9,sVar7 - (long)iVar9,cf->data[2],
                                        protocol_violation_types,8);
            iVar9 = iVar9 + iVar3;
            iVar3 = snprintf(pcVar10 + iVar9,sVar7 - (long)iVar9,"}{");
            iVar9 = iVar9 + iVar3;
            if ((byte)(cf->data[3] - 1) < 0x1f) {
              iVar3 = snprintf(pcVar10 + iVar9,sVar7 - (long)iVar9,"%s",
                               protocol_violation_locations_rel +
                               *(int *)(protocol_violation_locations_rel + (ulong)cf->data[3] * 4));
              iVar9 = iVar9 + iVar3;
            }
            iVar3 = snprintf(pcVar10 + iVar9,sVar7 - (long)iVar9,"}}");
            iVar9 = iVar9 + iVar3;
          }
LAB_00102635:
          iVar8 = iVar9 + iVar8;
        default:
          goto switchD_001024af_caseD_4;
        case 9:
          iVar9 = 0;
          sVar7 = len - (long)iVar8;
          if (sVar7 != 0) {
            iVar9 = snprintf(buf + iVar8,sVar7,"{{%d}{%d}}",(ulong)cf->data[6],(ulong)cf->data[7]);
          }
        }
        iVar8 = iVar8 + iVar9;
switchD_001024af_caseD_4:
        iVar5 = iVar5 + 1;
LAB_0010267e:
        lVar12 = lVar12 + 1;
        piVar6 = piVar6 + 1;
      } while (lVar12 != 10);
      if (((cf->can_id & 0x200) == 0) && ((cf->data[6] != '\0' || (cf->data[7] != '\0')))) {
        iVar9 = 0;
        iVar5 = snprintf(buf + iVar8,len - (long)iVar8,"%serror-counter-tx-rx",pcVar4);
        iVar8 = iVar8 + iVar5;
        sVar7 = len - (long)iVar8;
        if (sVar7 != 0) {
          iVar9 = snprintf(buf + iVar8,sVar7,"{{%d}{%d}}",(ulong)cf->data[6],(ulong)cf->data[7]);
        }
        iVar8 = iVar9 + iVar8;
      }
    }
    else {
      iVar8 = 0;
      fprintf(_stderr,"Error class %#x is invalid\n");
    }
  }
  return iVar8;
}

Assistant:

int snprintf_can_error_frame(char *buf, size_t len, const struct canfd_frame *cf,
                  const char* sep)
{
	canid_t class, mask;
	int i, n = 0, classes = 0;
	char *defsep = ",";

	if (!(cf->can_id & CAN_ERR_FLAG))
		return 0;

	class = cf->can_id & CAN_EFF_MASK;
	if (class > (1 << ARRAY_SIZE(error_classes))) {
		fprintf(stderr, "Error class %#x is invalid\n", class);
		return 0;
	}

	if (!sep)
		sep = defsep;

	for (i = 0; i < (int)ARRAY_SIZE(error_classes); i++) {
		mask = 1 << i;
		if (class & mask) {
			int tmp_n = 0;
			if (classes) {
				/* Fix for potential buffer overflow https://lgtm.com/rules/1505913226124/ */
				tmp_n = snprintf(buf + n, len - n, "%s", sep);
				if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
					buf[0] = 0; /* empty terminated string */
					return 0;
				}
				n += tmp_n;
			}
			tmp_n = snprintf(buf + n, len - n, "%s", error_classes[i]);
			if (tmp_n < 0 || (size_t)tmp_n >= len - n) {
				buf[0] = 0; /* empty terminated string */
				return 0;
			}
			n += tmp_n;
			if (mask == CAN_ERR_LOSTARB)
				n += snprintf_error_lostarb(buf + n, len - n,
							   cf);
			if (mask == CAN_ERR_CRTL)
				n += snprintf_error_ctrl(buf + n, len - n, cf);
			if (mask == CAN_ERR_PROT)
				n += snprintf_error_prot(buf + n, len - n, cf);
			if (mask == CAN_ERR_CNT)
				n += snprintf_error_cnt(buf + n, len - n, cf);
			classes++;
		}
	}

	if (!(cf->can_id & CAN_ERR_CNT) && (cf->data[6] || cf->data[7])) {
		n += snprintf(buf + n, len - n, "%serror-counter-tx-rx", sep);
		n += snprintf_error_cnt(buf + n, len - n, cf);
	}

	return n;
}